

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::BasicSharedStruct::RunIteration
          (BasicSharedStruct *this,bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int i;
  void *__s;
  void *pvVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  uint uVar9;
  GLuint groups [3];
  float local_50 [4];
  undefined1 *local_40;
  undefined4 local_38;
  
  __s = operator_new(0x1000);
  memset(__s,0,0x1000);
  if (this->m_storage_buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x1000,__s,0x88e8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  if (dispatch_indirect) {
    local_40 = &DAT_100000001;
    local_38 = 1;
    if (this->m_dispatch_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
    }
    glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,this->m_dispatch_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_40,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar9 = 0;
  pvVar5 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x1000,1);
  bVar8 = true;
  lVar7 = 0;
  do {
    lVar6 = lVar7 * 0x10;
    fVar1 = *(float *)((long)pvVar5 + lVar6);
    fVar2 = *(float *)((long)pvVar5 + lVar6 + 4);
    fVar3 = *(float *)((long)pvVar5 + lVar6 + 8);
    fVar4 = *(float *)((long)pvVar5 + lVar6 + 0xc);
    lVar6 = 0;
    do {
      local_50[lVar6] = (float)(int)uVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    if (((((fVar1 != local_50[0]) || (NAN(fVar1) || NAN(local_50[0]))) || (fVar2 != local_50[1])) ||
        ((NAN(fVar2) || NAN(local_50[1]) || (fVar3 != local_50[2])))) ||
       (NAN(fVar3) || NAN(local_50[2]))) {
LAB_00c1dff6:
      bVar8 = false;
      anon_unknown_0::Output("Invalid data at index %d.\n",(ulong)uVar9);
    }
    else if ((fVar4 != local_50[3]) || (NAN(fVar4) || NAN(local_50[3]))) goto LAB_00c1dff6;
    uVar9 = uVar9 + 1;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x100) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      operator_delete(__s,0x1000);
      return bVar8;
    }
  } while( true );
}

Assistant:

bool RunIteration(bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256;

		std::vector<vec4> data(kBufferSize);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(vec4) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		vec4* result;
		result = static_cast<vec4*>(
			glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(vec4) * kBufferSize, GL_MAP_READ_BIT));
		bool res = true;
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (!IsEqual(result[i], vec4(static_cast<float>(i))))
			{
				Output("Invalid data at index %d.\n", i);
				res = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return res;
	}